

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC2TL1SLScreenDropFrameTest
          (DatarateTestSVC *this)

{
  bool bVar1;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var2;
  char *message;
  DatarateTestSVC *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_array [2];
  I420VideoSource video;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe54;
  double *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  int iVar5;
  Message *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  Type TVar6;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe90;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffec8;
  AssertHelper *in_stack_fffffffffffffed0;
  AssertionResult local_118 [2];
  double local_f8;
  AssertionResult local_f0;
  int local_dc;
  uint local_c4;
  HasNewFatalFailureHelper local_c0;
  uint local_a8 [7];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 0x32;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 0x32;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 100;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0x1e;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x34;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",&local_89);
  uVar4 = 300;
  uVar3 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (uint)((ulong)in_stack_fffffffffffffe70 >> 0x20),(uint)in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),(int)in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe90,(int)in_RDI);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_a8[0] = 0x3c;
  local_a8[1] = 100;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var2 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7c8e79);
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate = local_a8[*p_Var2];
  (*(in_RDI->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])();
  in_RDI->screen_mode_ = 1;
  in_RDI->number_temporal_layers_ = 2;
  in_RDI->number_spatial_layers_ = 1;
  in_RDI->target_layer_bitrate_[0] =
       ((in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate * 0x3c) / 100;
  in_RDI->target_layer_bitrate_[1] =
       (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  bVar1 = testing::internal::AlwaysTrue();
  TVar6 = (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffe80)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&in_RDI->super_DatarateTest,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_c0);
    if (bVar1) {
      local_c4 = 2;
    }
    else {
      local_c4 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe54,uVar4));
    TVar6 = (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    if (local_c4 == 0) {
      for (local_dc = 0; TVar6 = (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20),
          local_dc < in_RDI->number_temporal_layers_ * in_RDI->number_spatial_layers_;
          local_dc = local_dc + 1) {
        local_f8 = (double)in_RDI->target_layer_bitrate_[local_dc] * 0.75;
        testing::internal::CmpHelperGE<double,double>
                  (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   (double *)CONCAT44(in_stack_fffffffffffffe54,uVar4));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe80);
          in_stack_fffffffffffffe80 =
               (HasNewFatalFailureHelper *)
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffe54,uVar4),
                          (char (*) [61])CONCAT44(in_stack_fffffffffffffe4c,uVar3));
          in_stack_fffffffffffffe78 =
               (string *)testing::AssertionResult::failure_message((AssertionResult *)0x7c91c1);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe80,
                     (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                     (char *)in_stack_fffffffffffffe70,
                     (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),in_stack_fffffffffffffe60);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,uVar4));
          testing::Message::~Message((Message *)0x7c921b);
        }
        local_c4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7c92a2);
        if (local_c4 != 0) goto LAB_007c95a5;
        testing::internal::CmpHelperLE<double,double>
                  (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   (double *)CONCAT44(in_stack_fffffffffffffe54,uVar4));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe80);
          in_stack_fffffffffffffe70 =
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffe54,uVar4),
                          (char (*) [63])CONCAT44(in_stack_fffffffffffffe4c,uVar3));
          in_stack_fffffffffffffe68 =
               testing::AssertionResult::failure_message((AssertionResult *)0x7c936c);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe80,
                     (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                     (char *)in_stack_fffffffffffffe70,
                     (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),in_stack_fffffffffffffe60);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,uVar4));
          testing::Message::~Message((Message *)0x7c93c6);
        }
        local_c4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7c944a);
        if (local_c4 != 0) goto LAB_007c95a5;
      }
      GetMismatchFrames(in_RDI);
      testing::internal::CmpHelperLE<int,int>
                (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 (int *)in_stack_fffffffffffffe58,(int *)CONCAT44(in_stack_fffffffffffffe54,uVar4));
      iVar5 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffec0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe80);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x7c94ea);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe80,TVar6,(char *)in_stack_fffffffffffffe70
                   ,iVar5,message);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,uVar4));
        testing::Message::~Message((Message *)0x7c9538);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x7c959a);
      local_c4 = 0;
      goto LAB_007c95a5;
    }
    if (local_c4 != 2) goto LAB_007c95a5;
  }
  iVar5 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffe80);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe80,TVar6,(char *)in_stack_fffffffffffffe70,iVar5
             ,in_stack_fffffffffffffe60);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8._M_head_impl);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,uVar4));
  testing::Message::~Message((Message *)0x7c9095);
  local_c4 = 1;
LAB_007c95a5:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x7c95b2);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC2TL1SLScreenDropFrameTest() {
    cfg_.rc_buf_initial_sz = 50;
    cfg_.rc_buf_optimal_sz = 50;
    cfg_.rc_buf_sz = 100;
    cfg_.rc_dropframe_thresh = 30;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 52;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;

    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 300);

    const int bitrate_array[2] = { 60, 100 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    screen_mode_ = 1;
    number_temporal_layers_ = 2;
    number_spatial_layers_ = 1;
    target_layer_bitrate_[0] = 60 * cfg_.rc_target_bitrate / 100;
    target_layer_bitrate_[1] = cfg_.rc_target_bitrate;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.75)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.8)
          << " The datarate for the file is greater than target by too much!";
    }
#if CONFIG_AV1_DECODER
    // Top temporal layers are non_reference, so exlcude them from
    // mismatch count, since loopfilter/cdef is not applied for these on
    // encoder side, but is always applied on decoder.
    // This means 300 = #frames(300) - #TL2_frames(150).
    // We use LE for screen since loopfilter level can become very small
    // or zero and then the frame is not a mismatch.
    EXPECT_LE((int)GetMismatchFrames(), 150);
#endif
  }